

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzquadratictetra.cpp
# Opt level: O0

void pzgeom::TPZQuadraticTetra::X<Fad<double>>
               (TPZFMatrix<double> *nodes,TPZVec<Fad<double>_> *loc,TPZVec<Fad<double>_> *x)

{
  int iVar1;
  int64_t row;
  TPZVec<Fad<double>_> *in_RDX;
  TPZBaseMatrix *in_RDI;
  FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_> *extraout_XMM0_Qa;
  int i_1;
  int j;
  int i;
  int space;
  TPZFNMatrix<30,_Fad<double>_> dphi;
  TPZFNMatrix<10,_Fad<double>_> phi;
  FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_> *this;
  double *in_stack_fffffffffffff928;
  Fad<double> *in_stack_fffffffffffff930;
  TPZFMatrix<Fad<double>_> *this_00;
  FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_> *in_stack_fffffffffffff948;
  Fad<double> *in_stack_fffffffffffff950;
  int local_6a0;
  int local_69c;
  undefined4 in_stack_fffffffffffff970;
  undefined4 in_stack_fffffffffffff974;
  int iVar2;
  undefined4 in_stack_fffffffffffff978;
  undefined4 in_stack_fffffffffffff97c;
  TPZFNMatrix<30,_Fad<double>_> *in_stack_fffffffffffff980;
  
  this_00 = (TPZFMatrix<Fad<double>_> *)0xa;
  TPZFNMatrix<10,_Fad<double>_>::TPZFNMatrix
            ((TPZFNMatrix<10,_Fad<double>_> *)in_stack_fffffffffffff980,
             CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978),
             CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970));
  TPZFNMatrix<30,_Fad<double>_>::TPZFNMatrix
            (in_stack_fffffffffffff980,CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978)
             ,CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970));
  TShape<Fad<double>>((TPZVec<Fad<double>_> *)dphi.fBuf[0x1a].val_,
                      (TPZFMatrix<Fad<double>_> *)dphi.fBuf[0x19].defaultVal,
                      (TPZFMatrix<Fad<double>_> *)dphi.fBuf[0x19].dx_.ptr_to_data);
  row = TPZBaseMatrix::Rows(in_RDI);
  iVar1 = (int)row;
  for (iVar2 = 0; iVar2 < 3; iVar2 = iVar2 + 1) {
    in_stack_fffffffffffff930 = TPZVec<Fad<double>_>::operator[](in_RDX,(long)iVar2);
    Fad<double>::operator=<double,_nullptr>(in_stack_fffffffffffff930,in_stack_fffffffffffff928);
  }
  for (local_69c = 0; local_69c < 10; local_69c = local_69c + 1) {
    for (local_6a0 = 0; local_6a0 < iVar1; local_6a0 = local_6a0 + 1) {
      TPZFMatrix<Fad<double>_>::operator()(this_00,row,(int64_t)in_stack_fffffffffffff930);
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)local_6a0,(long)local_69c);
      this = extraout_XMM0_Qa;
      operator*<Fad<double>,_double,_nullptr>
                ((Fad<double> *)CONCAT44(in_stack_fffffffffffff97c,iVar1),
                 (double)CONCAT44(iVar2,in_stack_fffffffffffff970));
      TPZVec<Fad<double>_>::operator[](in_RDX,(long)local_6a0);
      Fad<double>::operator+=(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
      FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>::~FadExpr(this);
    }
  }
  TPZFNMatrix<30,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<30,_Fad<double>_> *)0x185dd4c);
  TPZFNMatrix<10,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<10,_Fad<double>_> *)0x185dd59);
  return;
}

Assistant:

void TPZQuadraticTetra::X(const TPZFMatrix<REAL> &nodes,TPZVec<T> &loc,TPZVec<T> &x){
    
    TPZFNMatrix<10,T> phi(NNodes,1);
    TPZFNMatrix<30,T> dphi(3,NNodes);
    TShape(loc,phi,dphi);
    int space = nodes.Rows();
    for (int i=0; i<3; i++) {
        x[i] = 0.;
    }
    for(int j = 0; j < NNodes; j++) {
        for(int i = 0; i < space; i++) {
            x[i] += phi(j,0)*nodes.GetVal(i,j);
        }
    }
}